

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexerHelper.cxx
# Opt level: O0

bool __thiscall
cmCTestResourceGroupsLexerHelper::ParseString(cmCTestResourceGroupsLexerHelper *this,string *value)

{
  int iVar1;
  char *yystr;
  YY_BUFFER_STATE b;
  int retval;
  yy_buffer_state *state;
  yyscan_t lexer;
  string *value_local;
  cmCTestResourceGroupsLexerHelper *this_local;
  
  lexer = value;
  value_local = (string *)this;
  cmCTestResourceGroups_yylex_init_extra(this,&state);
  yystr = (char *)std::__cxx11::string::c_str();
  b = cmCTestResourceGroups_yy_scan_string(yystr,state);
  iVar1 = cmCTestResourceGroups_yylex(state);
  cmCTestResourceGroups_yy_delete_buffer(b,state);
  cmCTestResourceGroups_yylex_destroy(state);
  return iVar1 == 0;
}

Assistant:

bool cmCTestResourceGroupsLexerHelper::ParseString(const std::string& value)
{
  yyscan_t lexer;
  cmCTestResourceGroups_yylex_init_extra(this, &lexer);

  auto* state = cmCTestResourceGroups_yy_scan_string(value.c_str(), lexer);
  int retval = cmCTestResourceGroups_yylex(lexer);
  cmCTestResourceGroups_yy_delete_buffer(state, lexer);

  cmCTestResourceGroups_yylex_destroy(lexer);
  return retval == 0;
}